

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_base.h
# Opt level: O2

void mp::
     WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,2ul>,std::array<int,0ul>,mp::NumericFunctionalConstraintTraits,mp::PowId>
               (BasicMemoryWriter<char,_std::allocator<char>_> *wrt,
               CustomFunctionalConstraint<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::PowId>
               *cfc,ItemNamer *vnam)

{
  char *__s;
  size_t sVar1;
  BasicWriter<char> *this;
  size_t i;
  BasicStringRef<char> value;
  BasicStringRef<char> value_00;
  
  i = (size_t)(cfc->super_FunctionalConstraint).result_var_;
  if (-1 < (long)i) {
    __s = ItemNamer::at(vnam,i);
    sVar1 = strlen(__s);
    value.size_ = sVar1;
    value.data_ = __s;
    this = fmt::BasicWriter<char>::operator<<(&wrt->super_BasicWriter<char>,value);
    value_00.size_ = 4;
    value_00.data_ = " == ";
    fmt::BasicWriter<char>::operator<<(this,value_00);
  }
  WriteModelItem<fmt::BasicMemoryWriter<char,std::allocator<char>>,std::array<int,2ul>,std::array<int,0ul>,mp::PowId>
            (wrt,&cfc->
                  super_CustomConstraintData<std::array<int,_2UL>,_std::array<int,_0UL>,_mp::PowId>,
             vnam);
  return;
}

Assistant:

inline void WriteModelItem(
    Writer& wrt,
    const CustomFunctionalConstraint<A,P,N,I>& cfc,
    ItemNamer& vnam) {
  if (cfc.HasResultVar())   // really functional
    wrt << vnam.at(cfc.GetResultVar()) << " == ";
  WriteModelItem(
      wrt, (const CustomConstraintData<A, P, I>&)cfc, vnam);
}